

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

bool ON_WildCardMatchNoCase(char *s,char *pattern)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  
  if (pattern == (char *)0x0) {
LAB_005b6bf2:
    if (s == (char *)0x0) {
LAB_005b6c10:
      bVar4 = true;
    }
    else {
      bVar4 = *s == '\0';
    }
  }
  else {
    cVar3 = *pattern;
LAB_005b6b8d:
    if (cVar3 == '\0') goto LAB_005b6bf2;
    if (cVar3 != '*') {
      do {
        if (cVar3 == '?') {
          if (*s == '\0') goto LAB_005b6c34;
        }
        else {
          if (cVar3 == '\\') {
            cVar2 = pattern[1];
            if ((cVar2 == '?') || (cVar2 == '*')) {
              pattern = pattern + 1;
              cVar3 = cVar2;
            }
          }
          else if (cVar3 == '*') goto LAB_005b6b8d;
          iVar5 = toupper((int)cVar3);
          cVar3 = *s;
          iVar6 = toupper((int)cVar3);
          if (iVar5 != iVar6) goto LAB_005b6c34;
          if (cVar3 == '\0') goto LAB_005b6c10;
        }
        s = s + 1;
        cVar3 = pattern[1];
        pattern = pattern + 1;
      } while( true );
    }
    do {
      pcVar1 = pattern + 1;
      pattern = pattern + 1;
    } while (*pcVar1 == '*');
    if (*pcVar1 == '\0') goto LAB_005b6c10;
    if (*s == '\0') {
LAB_005b6c34:
      bVar4 = false;
    }
    else {
      while (bVar4 = ON_WildCardMatchNoCase(s,pattern), !bVar4) {
        pcVar1 = s + 1;
        s = s + 1;
        if (*pcVar1 == '\0') {
          return bVar4;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool ON_WildCardMatchNoCase(const char* s, const char* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' ) 
  {
    pattern++;
    while ( *pattern == '*' )
      pattern++;
    
    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatchNoCase(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' ) {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }
    
    if ( *pattern == '\\' ) {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( toupper(*pattern) != toupper(*s) ) {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }
  
  return ON_WildCardMatchNoCase(s,pattern);
}